

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O1

Transaction * __thiscall
duckdb::DuckTransactionManager::StartTransaction
          (DuckTransactionManager *this,ClientContext *context)

{
  ulong start_time;
  transaction_t transaction_id;
  pointer puVar1;
  mutex_type **ppmVar2;
  _Head_base<0UL,_std::lock_guard<std::mutex>_*,_false> _Var3;
  int iVar4;
  MetaTransaction *pMVar5;
  _Head_base<0UL,_std::lock_guard<std::mutex>_*,_false> _Var6;
  DuckTransaction *this_00;
  type pDVar7;
  InternalException *this_01;
  pointer __p;
  unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>,_true>
  start_lock;
  templated_unique_single_t transaction;
  _Head_base<0UL,_std::lock_guard<std::mutex>_*,_false> local_58;
  string local_50;
  
  pMVar5 = TransactionContext::ActiveTransaction(&context->transaction);
  local_58._M_head_impl = (lock_guard<std::mutex> *)0x0;
  if (pMVar5->is_read_only == false) {
    _Var6._M_head_impl = (lock_guard<std::mutex> *)operator_new(8);
    (_Var6._M_head_impl)->_M_device = &this->start_transaction_lock;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->start_transaction_lock);
    _Var3._M_head_impl = local_58._M_head_impl;
    if (iVar4 != 0) {
      ::std::__throw_system_error(iVar4);
    }
    local_50._M_dataplus._M_p = (pointer)0x0;
    if (local_58._M_head_impl != (lock_guard<std::mutex> *)0x0) {
      ppmVar2 = &(local_58._M_head_impl)->_M_device;
      local_58._M_head_impl = _Var6._M_head_impl;
      pthread_mutex_unlock((pthread_mutex_t *)*ppmVar2);
      operator_delete(_Var3._M_head_impl);
      _Var6._M_head_impl = local_58._M_head_impl;
    }
    local_58._M_head_impl = _Var6._M_head_impl;
    ::std::
    unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
    ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                 *)&local_50);
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->transaction_lock);
  if (iVar4 == 0) {
    start_time = this->current_start_timestamp;
    if (start_time < 0x4000000000000060) {
      this->current_start_timestamp = start_time + 1;
      transaction_id = this->current_transaction_id;
      puVar1 = (this->active_transactions).
               super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this->current_transaction_id = transaction_id + 1;
      if (puVar1 == (this->active_transactions).
                    super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        LOCK();
        (this->lowest_active_start).super___atomic_base<unsigned_long>._M_i = start_time;
        UNLOCK();
        LOCK();
        (this->lowest_active_id).super___atomic_base<unsigned_long>._M_i = transaction_id;
        UNLOCK();
      }
      this_00 = (DuckTransaction *)operator_new(400);
      DuckTransaction::DuckTransaction
                (this_00,this,context,start_time,transaction_id,this->last_committed_version);
      local_50._M_dataplus._M_p = (pointer)this_00;
      pDVar7 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator*((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                            *)&local_50);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
                ((vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                  *)&this->active_transactions,
                 (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                  *)&local_50);
      if ((DuckTransaction *)local_50._M_dataplus._M_p != (DuckTransaction *)0x0) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->transaction_lock);
      ::std::
      unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
      ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                   *)&local_58);
      return &pDVar7->super_Transaction;
    }
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "Cannot start more transactions, ran out of transaction identifiers!","");
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

Transaction &DuckTransactionManager::StartTransaction(ClientContext &context) {
	// obtain the transaction lock during this function
	auto &meta_transaction = MetaTransaction::Get(context);
	unique_ptr<lock_guard<mutex>> start_lock;
	if (!meta_transaction.IsReadOnly()) {
		start_lock = make_uniq<lock_guard<mutex>>(start_transaction_lock);
	}
	lock_guard<mutex> lock(transaction_lock);
	if (current_start_timestamp >= TRANSACTION_ID_START) { // LCOV_EXCL_START
		throw InternalException("Cannot start more transactions, ran out of "
		                        "transaction identifiers!");
	} // LCOV_EXCL_STOP

	// obtain the start time and transaction ID of this transaction
	transaction_t start_time = current_start_timestamp++;
	transaction_t transaction_id = current_transaction_id++;
	if (active_transactions.empty()) {
		lowest_active_start = start_time;
		lowest_active_id = transaction_id;
	}

	// create the actual transaction
	auto transaction = make_uniq<DuckTransaction>(*this, context, start_time, transaction_id, last_committed_version);
	auto &transaction_ref = *transaction;

	// store it in the set of active transactions
	active_transactions.push_back(std::move(transaction));
	return transaction_ref;
}